

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 14_recursive_func.cpp
# Opt level: O3

void init_ruler(char *arr)

{
  builtin_strncpy(arr,"|                                                         |",0x3c);
  return;
}

Assistant:

void init_ruler (char arr[]) {
    //  初始化
    int i = 0;
    for(i = 0; i < LENGTH - 2; i++) {
        arr[i] = ' ';
    }
    arr[LENGTH - 1] = '\0';

    int max = LENGTH - 2;
    int min = 0;
    arr[max] = arr[min] = '|';
}